

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O3

void __thiscall
ParticleFilter::prediction
          (ParticleFilter *this,double delta_t,double *std,double velocity,double yaw_rate)

{
  uint uVar1;
  pointer pPVar2;
  double *pdVar3;
  size_t __i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  result_type rVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong in_XMM2_Qb;
  double dist;
  normal_distribution<double> ns_y;
  normal_distribution<double> ns_x;
  normal_distribution<double> ns_t;
  mt19937 gen;
  random_device rd;
  normal_distribution<double> local_27b8;
  normal_distribution<double> local_2798;
  normal_distribution<double> local_2778;
  double local_2758;
  ulong uStack_2750;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar2) {
    local_2758 = ABS(yaw_rate);
    uStack_2750 = in_XMM2_Qb & 0x7fffffffffffffff;
    uVar6 = 0;
    do {
      dVar9 = pPVar2[uVar6].theta;
      ::std::random_device::random_device(&local_13b8);
      uVar1 = ::std::random_device::_M_getval();
      local_2740._M_x[0] = (unsigned_long)uVar1;
      lVar4 = 1;
      uVar5 = local_2740._M_x[0];
      do {
        uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
        local_2740._M_x[lVar4] = uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      local_2740._M_p = 0x270;
      local_2798._M_param._M_stddev = *std;
      local_2798._M_param._M_mean = 0.0;
      local_2798._M_saved = 0.0;
      local_2798._M_saved_available = false;
      local_27b8._M_param._M_stddev = std[1];
      local_27b8._M_param._M_mean = 0.0;
      local_27b8._M_saved = 0.0;
      local_27b8._M_saved_available = false;
      local_2778._M_param._M_stddev = std[2];
      local_2778._M_param._M_mean = 0.0;
      local_2778._M_saved = 0.0;
      local_2778._M_saved_available = false;
      if (0.001 <= local_2758) {
        dVar7 = yaw_rate * delta_t + dVar9;
        dVar10 = sin(dVar7);
        dVar11 = sin(dVar9);
        rVar8 = ::std::normal_distribution<double>::operator()
                          (&local_2798,&local_2740,&local_2798._M_param);
        pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar2[uVar6].x = rVar8 + ((dVar10 - dVar11) * velocity) / yaw_rate + pPVar2[uVar6].x;
        dVar9 = cos(dVar9);
        dVar7 = cos(dVar7);
        rVar8 = ::std::normal_distribution<double>::operator()
                          (&local_27b8,&local_2740,&local_27b8._M_param);
        pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar2[uVar6].y = rVar8 + ((dVar9 - dVar7) * velocity) / yaw_rate + pPVar2[uVar6].y;
        rVar8 = ::std::normal_distribution<double>::operator()
                          (&local_2778,&local_2740,&local_2778._M_param);
        dVar9 = rVar8 + yaw_rate * delta_t;
        pdVar3 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6].theta;
      }
      else {
        dVar7 = cos(dVar9);
        rVar8 = ::std::normal_distribution<double>::operator()
                          (&local_2798,&local_2740,&local_2798._M_param);
        pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar2[uVar6].x = dVar7 * delta_t * velocity + rVar8 + pPVar2[uVar6].x;
        dVar9 = sin(dVar9);
        rVar8 = ::std::normal_distribution<double>::operator()
                          (&local_27b8,&local_2740,&local_27b8._M_param);
        dVar9 = dVar9 * delta_t * velocity + rVar8;
        pdVar3 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6].y;
      }
      *pdVar3 = dVar9 + *pdVar3;
      ::std::random_device::_M_fini();
      uVar6 = uVar6 + 1;
      pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) *
              -0x3333333333333333;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  return;
}

Assistant:

void ParticleFilter::prediction(double delta_t, double std[], double velocity, double yaw_rate) 
{
  for (int i=0; i<particles.size(); i++)
  {
    double dist = velocity * delta_t;
    double theta = particles[i].theta;

    std::random_device rd;
    std::mt19937 gen(rd());
    std::normal_distribution<> ns_x(0.0, std[0]);
    std::normal_distribution<> ns_y(0.0, std[1]);
    std::normal_distribution<> ns_t(0.0, std[2]);

    // Conditionally do the full prediction including yaw rate
    if (fabs(yaw_rate) < 0.001)
    {
      particles[i].x += dist * cos(theta) + ns_x(gen);
      particles[i].y += dist * sin(theta) + ns_y(gen);
    }
    else
    {
      particles[i].x += velocity * (sin(theta + yaw_rate * delta_t) - sin(theta)) / yaw_rate + ns_x(gen);
      particles[i].y += velocity * (cos(theta) - cos(theta + yaw_rate * delta_t)) / yaw_rate + ns_y(gen);
      particles[i].theta += yaw_rate * delta_t + ns_t(gen);
    }
  }
}